

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint8_t uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  array_container_t *c;
  uint16_t *puVar4;
  ulong uVar5;
  shared_container_t *sc;
  array_container_t *run;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  void **ppvVar9;
  rle16_t *prVar10;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ushort uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  byte bVar26;
  int iVar27;
  ulong uVar28;
  uint8_t new_type;
  uint8_t local_61;
  uint local_60;
  uint local_5c;
  ulong local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  if (min <= max) {
    uVar14 = min >> 0x10;
    iVar27 = (r->high_low_container).size;
    if (iVar27 == 0) {
      uVar18 = 0;
    }
    else {
      if (iVar27 < 1) {
        uVar7 = 0xffffffff;
      }
      else {
        iVar25 = iVar27 + -1;
        uVar20 = 0;
        do {
          uVar7 = iVar25 + uVar20 >> 1;
          uVar19 = *(ushort *)
                    ((long)(r->high_low_container).keys + (ulong)(iVar25 + uVar20 & 0xfffffffe));
          uVar13 = (ushort)(min >> 0x10);
          if (uVar19 < uVar13) {
            uVar20 = uVar7 + 1;
          }
          else {
            if (uVar19 <= uVar13) goto LAB_00102d2c;
            iVar25 = uVar7 - 1;
          }
        } while ((int)uVar20 <= iVar25);
        uVar7 = ~uVar20;
      }
LAB_00102d2c:
      uVar18 = (ulong)((int)uVar7 >> 0x1f ^ uVar7);
    }
    if ((int)uVar18 < iVar27) {
      uVar28 = (ulong)(int)uVar18;
      uVar19 = (r->high_low_container).keys[uVar28];
      uVar7 = (uint)uVar19;
      uVar16 = uVar18;
      local_4c = min;
      if ((uint)uVar19 <= max >> 0x10) {
        local_4c = min & 0xffff;
        local_44 = max & 0xffff;
        local_60 = uVar14;
        local_48 = max >> 0x10;
        do {
          uVar20 = 0;
          if (uVar14 == uVar7) {
            uVar20 = local_4c;
          }
          uVar16 = 0xffff;
          if (local_48 == uVar7) {
            uVar16 = (ulong)local_44;
          }
          ppvVar9 = (r->high_low_container).containers;
          puVar3 = (r->high_low_container).typecodes;
          uVar21 = uVar28 & 0xffff;
          sc = (shared_container_t *)ppvVar9[uVar21];
          local_58 = uVar18;
          if (puVar3[uVar21] == '\x04') {
            sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar21);
            ppvVar9 = (r->high_low_container).containers;
          }
          uVar18 = local_58;
          uVar14 = local_60;
          ppvVar9[uVar21] = sc;
          run = (array_container_t *)(r->high_low_container).containers[uVar28];
          uVar1 = (r->high_low_container).typecodes[uVar28];
          uVar13 = (ushort)uVar16;
          uVar7 = (uint)uVar16;
          uVar19 = (ushort)uVar20;
          if (uVar1 == '\x03') {
            iVar27 = run->cardinality;
            lVar15 = (long)iVar27;
            if ((lVar15 == 0) ||
               ((prVar10 = (rle16_t *)run->array, uVar20 <= prVar10->value &&
                ((ushort)(prVar10[lVar15 + -1].length + prVar10[lVar15 + -1].value) <= uVar7))))
            goto LAB_00103299;
            if (iVar27 < 1) {
              uVar18 = 0xffffffff;
              uVar8 = 0xffffffff;
LAB_001031ee:
              uVar8 = ~uVar8;
LAB_001033b4:
              uVar20 = (uint)uVar18;
              if ((int)uVar20 < 0) {
                uVar20 = -uVar20 - 2;
              }
              else {
                uVar19 = prVar10[uVar18].length + prVar10[uVar18].value;
                if (uVar7 < uVar19) {
                  prVar10[uVar18].value = uVar13 + 1;
                  prVar10[uVar18].length = uVar19 - (uVar13 + 1);
                  uVar20 = uVar20 - 1;
                }
              }
              if ((int)uVar8 <= (int)uVar20) {
                uVar20 = ~uVar20;
                iVar25 = iVar27 + uVar20;
                iVar12 = uVar8 + uVar20;
                if ((iVar12 != 0 && SCARRY4(uVar8,uVar20) == iVar12 < 0) &&
                   (run->capacity < iVar12 + iVar25)) {
                  run_container_grow((run_container_t *)run,iVar12 + iVar25,true);
                  iVar27 = run->cardinality;
                  prVar10 = (rle16_t *)run->array;
                }
                memmove(prVar10 + ((iVar27 - iVar25) + iVar12),prVar10 + (iVar27 - iVar25),
                        (long)iVar25 << 2);
                run->cardinality = run->cardinality + iVar12;
              }
            }
            else {
              iVar12 = iVar27 + -1;
              uVar8 = 0;
              iVar25 = iVar12;
              do {
                uVar22 = iVar25 + uVar8 >> 1;
                uVar16 = (ulong)uVar22;
                if ((ushort)(prVar10[uVar16].length + prVar10[uVar16].value) < uVar19) {
                  uVar8 = uVar22 + 1;
                }
                else {
                  if (prVar10[uVar16].value <= uVar19) goto LAB_00102ee2;
                  iVar25 = uVar22 - 1;
                }
              } while ((int)uVar8 <= iVar25);
              uVar16 = (ulong)~uVar8;
LAB_00102ee2:
              uVar8 = (uint)uVar16;
              uVar22 = 0;
              do {
                uVar11 = iVar12 + uVar22 >> 1;
                uVar18 = (ulong)uVar11;
                if ((ushort)(prVar10[uVar18].length + prVar10[uVar18].value) < uVar13) {
                  uVar22 = uVar11 + 1;
                }
                else {
                  if (prVar10[uVar18].value <= uVar13) goto LAB_00102f16;
                  iVar12 = uVar11 - 1;
                }
              } while ((int)uVar22 <= iVar12);
              uVar18 = (ulong)~uVar22;
LAB_00102f16:
              if ((int)uVar8 < 0) goto LAB_001031ee;
              uVar2 = prVar10[uVar16].value;
              if (uVar20 <= uVar2) goto LAB_001033b4;
              if ((uint)prVar10[uVar16].length + (uint)uVar2 <= uVar7) {
                prVar10[uVar16].length = uVar19 + ~uVar2;
                uVar8 = uVar8 + 1;
                goto LAB_001033b4;
              }
              local_40 = uVar16;
              if (run->capacity <= iVar27) {
                run_container_grow((run_container_t *)run,iVar27 + 1,true);
                iVar27 = run->cardinality;
                prVar10 = (rle16_t *)run->array;
              }
              uVar8 = uVar8 + 1;
              uVar14 = uVar8 & 0xffff;
              memmove(prVar10 + (ulong)uVar14 + 1,prVar10 + uVar14,(long)(int)(iVar27 - uVar14) << 2
                     );
              run->cardinality = run->cardinality + 1;
              prVar10 = (rle16_t *)run->array;
              prVar10[uVar8].value = uVar13 + 1;
              uVar2 = prVar10[local_40].value;
              prVar10[uVar8].length = ~uVar13 + uVar2 + prVar10[local_40].length;
              prVar10[local_40].length = uVar19 + ~uVar2;
              uVar14 = local_60;
            }
            run = (array_container_t *)
                  convert_run_to_efficient_container((run_container_t *)run,&local_61);
            uVar18 = local_58;
          }
          else if (uVar1 == '\x02') {
            prVar10 = (rle16_t *)run->array;
            uVar7 = run->cardinality;
            uVar20 = 0;
            if (uVar7 == 0) {
              uVar8 = 0;
            }
            else {
              uVar8 = uVar7;
              uVar20 = 0;
              if (0 < (int)uVar7) {
                iVar27 = uVar7 - 1;
                iVar25 = 0;
                do {
                  uVar22 = (uint)(iVar27 + iVar25) >> 1;
                  uVar2 = *(ushort *)((long)&prVar10->value + (ulong)(iVar27 + iVar25 & 0xfffffffe))
                  ;
                  if (uVar2 < uVar13) {
                    iVar25 = uVar22 + 1;
                  }
                  else {
                    if (uVar2 <= uVar13) {
                      uVar11 = ~uVar22;
                      uVar8 = uVar7 + uVar11;
                      uVar20 = 0xffffffff;
                      if (uVar22 == 0x7fffffff) goto LAB_0010323d;
                      goto LAB_00103211;
                    }
                    iVar27 = uVar22 - 1;
                  }
                } while (iVar25 <= iVar27);
                iVar27 = -iVar25;
                if (0 < iVar25) {
                  iVar27 = iVar25;
                }
                uVar8 = uVar7 - iVar27;
                if (iVar25 == 0) {
                  uVar20 = 0;
                }
                else {
                  uVar11 = -iVar27;
LAB_00103211:
                  uVar11 = ~uVar11;
                  uVar22 = 0;
                  do {
                    uVar20 = uVar11 + uVar22 >> 1;
                    uVar13 = *(ushort *)
                              ((long)&prVar10->value + (ulong)(uVar11 + uVar22 & 0xfffffffe));
                    if (uVar13 < uVar19) {
                      uVar22 = uVar20 + 1;
                    }
                    else {
                      if (uVar13 <= uVar19) goto LAB_0010323d;
                      uVar11 = uVar20 - 1;
                    }
                  } while ((int)uVar22 <= (int)uVar11);
                  uVar20 = ~uVar22;
LAB_0010323d:
                  uVar20 = (int)uVar20 >> 0x1f ^ uVar20;
                }
              }
            }
            if (uVar20 + uVar8 == 0) {
LAB_00103299:
              run = (array_container_t *)0x0;
            }
            else {
              local_61 = '\x02';
              iVar27 = uVar7 - (uVar20 + uVar8);
              if (iVar27 != 0) {
                memmove(&prVar10->value + uVar20,&prVar10->value + (uVar20 + iVar27),
                        (ulong)uVar8 * 2);
                run->cardinality = run->cardinality - iVar27;
              }
            }
          }
          else {
            prVar10 = (rle16_t *)run->array;
            uVar8 = uVar20 >> 6;
            uVar23 = (ulong)uVar8;
            uVar5 = uVar16 >> 6;
            uVar21 = *(ulong *)(prVar10 + uVar23 * 2);
            uVar22 = (uint)uVar5;
            bVar6 = (byte)uVar20;
            bVar26 = (byte)uVar16;
            if (uVar22 == uVar8) {
              uVar16 = (0xffffffffffffffffU >> (~bVar26 + bVar6 & 0x3f)) << (bVar6 & 0x3f) & uVar21;
              uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
              uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
              uVar11 = (uint)(byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38);
            }
            else {
              uVar16 = (uVar21 >> (bVar6 & 0x3f)) << (bVar6 & 0x3f);
              uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
              uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
              uVar16 = ((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
              uVar17 = uVar16 >> 0x38;
              uVar11 = (uint)(byte)(uVar16 >> 0x38);
              if (uVar8 + 1 < uVar22) {
                uVar16 = (ulong)(uVar8 + 1);
                do {
                  uVar24 = *(ulong *)(prVar10 + uVar16 * 2) -
                           (*(ulong *)(prVar10 + uVar16 * 2) >> 1 & 0x5555555555555555);
                  uVar24 = (uVar24 >> 2 & 0x3333333333333333) + (uVar24 & 0x3333333333333333);
                  uVar11 = (int)uVar17 +
                           (uint)(byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) *
                                        0x101010101010101 >> 0x38);
                  uVar17 = (ulong)uVar11;
                  uVar16 = uVar16 + 1;
                  local_5c = uVar22;
                  local_38 = uVar23;
                } while (uVar5 != uVar16);
              }
              uVar16 = (ulong)(*(long *)(prVar10 + uVar5 * 2) << (~bVar26 & 0x3f)) >>
                       (~bVar26 & 0x3f);
              uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
              uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
              uVar11 = (byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x38) + uVar11;
              local_40 = uVar21;
            }
            iVar27 = run->cardinality - uVar11;
            if (iVar27 == 0) goto LAB_00103299;
            if (iVar27 < 0x1001) {
              local_61 = '\x02';
              if (uVar7 + 1 != uVar20) {
                uVar18 = -1L << (bVar6 & 0x3f);
                if (uVar22 == uVar8) {
                  uVar18 = (uVar18 << (~bVar26 & 0x3f)) >> (~bVar26 & 0x3f);
                }
                else {
                  *(ulong *)(prVar10 + uVar23 * 2) = uVar21 & ~uVar18;
                  if (uVar8 + 1 < uVar22) {
                    local_5c = uVar22;
                    memset(prVar10 + uVar23 * 2 + 2,0,(ulong)((uVar22 - uVar8) - 2) * 8 + 8);
                    uVar5 = (ulong)local_5c;
                  }
                  uVar23 = uVar5;
                  uVar18 = 0xffffffffffffffff >> (~bVar26 & 0x3f);
                  uVar21 = *(ulong *)(prVar10 + uVar23 * 2);
                }
                *(ulong *)(prVar10 + uVar23 * 2) = ~uVar18 & uVar21;
              }
              run->cardinality = iVar27;
              run = array_container_from_bitset((bitset_container_t *)run);
              uVar18 = local_58;
              uVar14 = local_60;
            }
            else {
              local_61 = '\x01';
              if (uVar7 + 1 != uVar20) {
                uVar18 = -1L << (bVar6 & 0x3f);
                if (uVar22 == uVar8) {
                  uVar18 = (uVar18 << (~bVar26 & 0x3f)) >> (~bVar26 & 0x3f);
                }
                else {
                  *(ulong *)(prVar10 + uVar23 * 2) = uVar21 & ~uVar18;
                  if (uVar8 + 1 < uVar22) {
                    local_5c = uVar22;
                    memset(prVar10 + uVar23 * 2 + 2,0,(ulong)((uVar22 - uVar8) - 2) * 8 + 8);
                    uVar5 = (ulong)local_5c;
                  }
                  uVar23 = uVar5;
                  uVar18 = 0xffffffffffffffff >> (~bVar26 & 0x3f);
                  uVar21 = *(ulong *)(prVar10 + uVar23 * 2);
                }
                *(ulong *)(prVar10 + uVar23 * 2) = ~uVar18 & uVar21;
              }
              run->cardinality = iVar27;
              uVar18 = local_58;
              uVar14 = local_60;
            }
          }
          c = (array_container_t *)(r->high_low_container).containers[uVar28];
          if (run != c) {
            container_free(c,(r->high_low_container).typecodes[uVar28]);
          }
          if (run != (array_container_t *)0x0) {
            puVar4 = (r->high_low_container).keys;
            iVar27 = (int)uVar18;
            puVar4[iVar27] = puVar4[uVar28];
            (r->high_low_container).containers[iVar27] = run;
            (r->high_low_container).typecodes[iVar27] = local_61;
            uVar18 = (ulong)(iVar27 + 1);
          }
          uVar28 = uVar28 + 1;
          iVar27 = (r->high_low_container).size;
          uVar16 = uVar28;
        } while (((long)uVar28 < (long)iVar27) &&
                (uVar7 = (uint)(r->high_low_container).keys[uVar28], uVar7 <= local_48));
      }
      iVar25 = (int)uVar16;
      if ((int)uVar18 < iVar25) {
        ra_shift_tail(&r->high_low_container,iVar27 - iVar25,(int)uVar18 - iVar25);
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_range_closed(roaring_bitmap_t *r, uint32_t min,
                                        uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t src = count_less(ra->keys, ra->size, (uint16_t)min_key);
    int32_t dst = src;
    while (src < ra->size && ra->keys[src] <= max_key) {
        uint32_t container_min =
            (min_key == ra->keys[src]) ? (min & 0xffff) : 0;
        uint32_t container_max =
            (max_key == ra->keys[src]) ? (max & 0xffff) : 0xffff;
        ra_unshare_container_at_index(ra, (uint16_t)src);
        container_t *new_container;
        uint8_t new_type;
        new_container =
            container_remove_range(ra->containers[src], ra->typecodes[src],
                                   container_min, container_max, &new_type);
        if (new_container != ra->containers[src]) {
            container_free(ra->containers[src], ra->typecodes[src]);
        }
        if (new_container) {
            ra_replace_key_and_container_at_index(ra, dst, ra->keys[src],
                                                  new_container, new_type);
            dst++;
        }
        src++;
    }
    if (src > dst) {
        ra_shift_tail(ra, ra->size - src, dst - src);
    }
}